

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O1

void print_data_test_case<std::__cxx11::string,long,char_const*,phosg::PrintDataFlags>
               (string *expected_output,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,long args_1,
               char *args_2,PrintDataFlags args_3)

{
  size_t sVar1;
  int iVar2;
  string output_data;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  string local_80;
  string local_60;
  code *local_40;
  FILE *local_38;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"StringsTest-data","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"w","");
  phosg::fopen_unique((phosg *)&local_40,&local_80,&local_60,(FILE *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  phosg::print_data(local_38,args,args_1,args_2,(ulong)args_3);
  if (local_38 != (FILE *)0x0) {
    (*local_40)();
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"StringsTest-data","");
  phosg::load_file(&local_80,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  sVar1 = expected_output->_M_string_length;
  if (sVar1 == local_80._M_string_length) {
    if (sVar1 != 0) {
      iVar2 = bcmp((expected_output->_M_dataplus)._M_p,local_80._M_dataplus._M_p,sVar1);
      if (iVar2 != 0) goto LAB_00113a9b;
    }
  }
  else {
LAB_00113a9b:
    fputs("(print_data) Expected:\n",_stderr);
    fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
    fputs("(print_data) Actual:\n",_stderr);
    fwrite(local_80._M_dataplus._M_p,1,local_80._M_string_length,_stderr);
    phosg::expect_generic
              (false,"!(false)",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
               ,0x1d);
  }
  phosg::format_data((string *)&local_60,args,args_1,args_2,(ulong)args_3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  sVar1 = expected_output->_M_string_length;
  if (sVar1 == local_80._M_string_length) {
    if (sVar1 == 0) goto LAB_00113b6c;
    iVar2 = bcmp((expected_output->_M_dataplus)._M_p,local_80._M_dataplus._M_p,sVar1);
    if (iVar2 == 0) goto LAB_00113b6c;
  }
  fputs("(format_data) Expected:\n",_stderr);
  fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
  fputs("(format_data) Actual:\n",_stderr);
  fwrite(local_80._M_dataplus._M_p,1,local_80._M_string_length,_stderr);
  phosg::expect_generic
            (false,"!(false)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x27);
LAB_00113b6c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void print_data_test_case(const string& expected_output, ArgTs... args) {

  // macOS doesn't have fmemopen, so we just write to a file because I'm too
  // lazy to use funopen()
  {
    auto f = fopen_unique("StringsTest-data", "w");
    print_data(f.get(), args...);
  }
  string output_data = load_file("StringsTest-data");

  if (expected_output != output_data) {
    fputs("(print_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(print_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }

  // Also test format_data - it should produce the same result
  output_data = format_data(args...);
  if (expected_output != output_data) {
    fputs("(format_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(format_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }
}